

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

uint64_t fio_siphash_xy(void *data,size_t len,size_t x,size_t y,uint64_t key1,uint64_t key2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong local_88;
  size_t i_1;
  uint8_t *pos;
  size_t i;
  anon_union_8_2_f9ece289 word;
  byte *pbStack_60;
  uint8_t len_mod;
  uint8_t *w8;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint64_t key2_local;
  uint64_t key1_local;
  size_t y_local;
  size_t x_local;
  size_t len_local;
  void *data_local;
  
  v1 = key1 ^ 0x7469686173716475;
  v2 = key2 ^ 0x6b617f6d656e6665;
  v3 = key1 ^ 0x6b7f62616d677361;
  w8 = (uint8_t *)(key2 ^ 0x7b6b696e727e6c7b);
  pbStack_60 = (byte *)data;
  for (x_local = len; 7 < x_local; x_local = x_local - 8) {
    uVar1 = (ulong)*pbStack_60 << 0x38 | (ulong)pbStack_60[1] << 0x30 | (ulong)pbStack_60[2] << 0x28
            | (ulong)pbStack_60[3] << 0x20 | (ulong)pbStack_60[4] << 0x18 |
            (ulong)pbStack_60[5] << 0x10 | (ulong)pbStack_60[6] << 8 | (ulong)pbStack_60[7];
    w8 = (uint8_t *)(uVar1 ^ (ulong)w8);
    for (pos = (uint8_t *)0x0; pos < x; pos = pos + 1) {
      uVar2 = ((long)w8 << 0x10 | (ulong)w8 >> 0x30) ^ (ulong)(w8 + v3);
      uVar3 = v2 + v1;
      uVar4 = (v2 << 0xd | v2 >> 0x33) ^ uVar3;
      puVar5 = w8 + v3 + uVar4;
      v1 = uVar2 + (uVar3 << 0x20 | uVar3 >> 0x20);
      v2 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ (ulong)puVar5;
      w8 = (uint8_t *)((uVar2 << 0x15 | uVar2 >> 0x2b) ^ v1);
      v3 = (long)puVar5 << 0x20 | (ulong)puVar5 >> 0x20;
    }
    v1 = uVar1 ^ v1;
    pbStack_60 = pbStack_60 + 8;
  }
  i = 0;
  switch(x_local) {
  case 7:
    i._6_1_ = pbStack_60[6];
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    i._0_1_ = *pbStack_60;
  default:
    i = CONCAT17((char)len,(undefined7)i);
    uVar1 = i ^ (ulong)w8;
    uVar2 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar1 + v3;
    uVar3 = v2 + v1;
    uVar4 = (v2 << 0xd | v2 >> 0x33) ^ uVar3;
    uVar1 = uVar4 + uVar1 + v3;
    uVar6 = uVar2 + (uVar3 << 0x20 | uVar3 >> 0x20);
    uVar3 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar1;
    uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar6;
    uVar4 = uVar2 + (uVar1 << 0x20 | uVar1 >> 0x20);
    uVar1 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar4;
    uVar6 = uVar3 + uVar6;
    uVar2 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar6;
    uVar4 = uVar2 + uVar4;
    uVar3 = uVar1 + (uVar6 << 0x20 | uVar6 >> 0x20);
    v2 = (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar4;
    w8 = (uint8_t *)((uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar3);
    v1 = i ^ uVar3;
    v3 = (uVar4 << 0x20 | uVar4 >> 0x20) ^ 0xff;
    for (local_88 = 0; local_88 < y; local_88 = local_88 + 1) {
      uVar1 = ((long)w8 << 0x10 | (ulong)w8 >> 0x30) ^ (ulong)(w8 + v3);
      uVar2 = v2 + v1;
      uVar3 = (v2 << 0xd | v2 >> 0x33) ^ uVar2;
      puVar5 = w8 + v3 + uVar3;
      v1 = uVar1 + (uVar2 << 0x20 | uVar2 >> 0x20);
      v2 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ (ulong)puVar5;
      w8 = (uint8_t *)((uVar1 << 0x15 | uVar1 >> 0x2b) ^ v1);
      v3 = (long)puVar5 << 0x20 | (ulong)puVar5 >> 0x20;
    }
    uVar1 = ((long)w8 << 0x10 | (ulong)w8 >> 0x30) ^ (ulong)(w8 + v3);
    uVar2 = v2 + v1;
    uVar3 = (v2 << 0xd | v2 >> 0x33) ^ uVar2;
    puVar5 = w8 + v3 + uVar3;
    uVar4 = uVar1 + (uVar2 << 0x20 | uVar2 >> 0x20);
    uVar2 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ (ulong)puVar5;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar4;
    uVar3 = uVar1 + ((long)puVar5 << 0x20 | (ulong)puVar5 >> 0x20);
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar3;
    uVar4 = uVar2 + uVar4;
    uVar2 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar4;
    uVar3 = uVar2 + uVar3;
    uVar4 = uVar1 + (uVar4 << 0x20 | uVar4 >> 0x20);
    uVar2 = (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar3;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar4;
    uVar3 = uVar1 + (uVar3 << 0x20 | uVar3 >> 0x20);
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar3;
    uVar4 = uVar2 + uVar4;
    uVar2 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar4;
    uVar3 = uVar2 + uVar3;
    uVar4 = uVar1 + (uVar4 << 0x20 | uVar4 >> 0x20);
    uVar2 = (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar3;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar4;
    uVar3 = uVar1 + (uVar3 << 0x20 | uVar3 >> 0x20);
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar3;
    uVar4 = uVar2 + uVar4;
    uVar2 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar4;
    uVar3 = uVar2 + uVar3;
    uVar4 = uVar1 + (uVar4 << 0x20 | uVar4 >> 0x20);
    return (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar3 ^ (uVar3 << 0x20 | uVar3 >> 0x20) ^
           (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar4 ^ uVar4;
  }
}

Assistant:

static inline uint64_t fio_siphash_xy(const void *data, size_t len, size_t x,
                                      size_t y, uint64_t key1, uint64_t key2) {
  /* initialize the 4 words */
  uint64_t v0 = (0x0706050403020100ULL ^ 0x736f6d6570736575ULL) ^ key1;
  uint64_t v1 = (0x0f0e0d0c0b0a0908ULL ^ 0x646f72616e646f6dULL) ^ key2;
  uint64_t v2 = (0x0706050403020100ULL ^ 0x6c7967656e657261ULL) ^ key1;
  uint64_t v3 = (0x0f0e0d0c0b0a0908ULL ^ 0x7465646279746573ULL) ^ key2;
  const uint8_t *w8 = data;
  uint8_t len_mod = len & 255;
  union {
    uint64_t i;
    uint8_t str[8];
  } word;

#define hash_map_SipRound                                                      \
  do {                                                                         \
    v2 += v3;                                                                  \
    v3 = fio_lrot64(v3, 16) ^ v2;                                              \
    v0 += v1;                                                                  \
    v1 = fio_lrot64(v1, 13) ^ v0;                                              \
    v0 = fio_lrot64(v0, 32);                                                   \
    v2 += v1;                                                                  \
    v0 += v3;                                                                  \
    v1 = fio_lrot64(v1, 17) ^ v2;                                              \
    v3 = fio_lrot64(v3, 21) ^ v0;                                              \
    v2 = fio_lrot64(v2, 32);                                                   \
  } while (0);

  while (len >= 8) {
    word.i = sip_local64(fio_str2u64(w8));
    v3 ^= word.i;
    /* Sip Rounds */
    for (size_t i = 0; i < x; ++i) {
      hash_map_SipRound;
    }
    v0 ^= word.i;
    w8 += 8;
    len -= 8;
  }
  word.i = 0;
  uint8_t *pos = word.str;
  switch (len) { /* fallthrough is intentional */
  case 7:
    pos[6] = w8[6];
    /* fallthrough */
  case 6:
    pos[5] = w8[5];
    /* fallthrough */
  case 5:
    pos[4] = w8[4];
    /* fallthrough */
  case 4:
    pos[3] = w8[3];
    /* fallthrough */
  case 3:
    pos[2] = w8[2];
    /* fallthrough */
  case 2:
    pos[1] = w8[1];
    /* fallthrough */
  case 1:
    pos[0] = w8[0];
  }
  word.str[7] = len_mod;

  /* last round */
  v3 ^= word.i;
  hash_map_SipRound;
  hash_map_SipRound;
  v0 ^= word.i;
  /* Finalization */
  v2 ^= 0xff;
  /* d iterations of SipRound */
  for (size_t i = 0; i < y; ++i) {
    hash_map_SipRound;
  }
  hash_map_SipRound;
  hash_map_SipRound;
  hash_map_SipRound;
  hash_map_SipRound;
  /* XOR it all together */
  v0 ^= v1 ^ v2 ^ v3;
#undef hash_map_SipRound
  return v0;
}